

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O1

bool __thiscall DAM::operator<(DAM *this,DAM *rhs)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  byte extraout_var;
  long lVar4;
  
  lVar4 = 0;
  do {
    iVar1 = *(int *)((long)(this->dam)._M_elems + lVar4);
    iVar2 = *(int *)((long)(rhs->dam)._M_elems + lVar4);
    if (iVar2 != iVar1) {
      if (iVar1 < iVar2) {
        return true;
      }
      break;
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 8);
  if (*(long *)(this->dam)._M_elems == *(long *)(rhs->dam)._M_elems) {
    std::__cxx11::string::compare((string *)&this->tag);
    bVar3 = (bool)(extraout_var >> 7);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator<(const DAM & rhs) const
    {
        if(dam < rhs.dam)
            return true;
        else if(dam == rhs.dam)
            return tag < rhs.tag;
        else
            return false;
    }